

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMapBufferAlignmentTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::MapBufferAlignment::Query::iterate(Query *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  char *description;
  GLint min_map_buffer_alignment;
  int local_1c;
  
  local_1c = 0;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x90bc,&local_1c);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMapBufferAlignmentTests.cpp"
                  ,0x7e);
  if (local_1c < 0x40) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,(uint)(local_1c < 0x40),description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult Query::iterate()
{
	GLint min_map_buffer_alignment = 0;
	bool  test_result			   = true;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	gl.getIntegerv(GL_MIN_MAP_BUFFER_ALIGNMENT, &min_map_buffer_alignment);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	if (m_min_map_buffer_alignment > min_map_buffer_alignment)
	{
		test_result = false;
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}